

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.h
# Opt level: O0

void __thiscall
Parfait::Octree<Parfait::Facet>::insert
          (Octree<Parfait::Facet> *this,int voxel_index,int object_index)

{
  bool bVar1;
  reference pvVar2;
  reference this_00;
  size_type __n;
  reference piVar3;
  iterator pvVar4;
  value_type_conflict1 child;
  iterator __end0_1;
  iterator __begin0_1;
  array<int,_8UL> *__range4;
  array<int,_8UL> children;
  iterator iStack_88;
  int i;
  iterator __end0;
  iterator __begin0;
  vector<int,_std::allocator<int>_> *__range5;
  undefined1 local_60 [8];
  vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> inside;
  Extent<double> extent;
  int object_index_local;
  int voxel_index_local;
  Octree<Parfait::Facet> *this_local;
  
  extent.hi.pos._M_elems[2]._0_4_ = object_index;
  extent.hi.pos._M_elems[2]._4_4_ = voxel_index;
  pvVar2 = std::
           vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
           ::at(&this->voxels,(long)voxel_index);
  memcpy(&inside.super__Vector_base<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,pvVar2,0x30);
  this_00 = std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::at
                      (&this->objects,(long)extent.hi.pos._M_elems[2]._0_4_);
  bVar1 = Facet::intersects(this_00,(Extent<double> *)
                                    &inside.
                                     super__Vector_base<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    pvVar2 = std::
             vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
             ::at(&this->voxels,(long)extent.hi.pos._M_elems[2]._4_4_);
    pvVar2->filled = true;
    pvVar2 = std::
             vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
             ::at(&this->voxels,(long)extent.hi.pos._M_elems[2]._4_4_);
    bVar1 = Node::isLeaf(pvVar2);
    if (bVar1) {
      pvVar2 = std::
               vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
               ::at(&this->voxels,(long)extent.hi.pos._M_elems[2]._4_4_);
      std::vector<int,_std::allocator<int>_>::push_back
                (&pvVar2->inside_objects,(value_type_conflict1 *)(extent.hi.pos._M_elems + 2));
      bVar1 = atMaxDepth(this,extent.hi.pos._M_elems[2]._4_4_);
      if (!bVar1) {
        std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>::vector
                  ((vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)local_60);
        pvVar2 = std::
                 vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                 ::at(&this->voxels,(long)extent.hi.pos._M_elems[2]._4_4_);
        __n = std::vector<int,_std::allocator<int>_>::size(&pvVar2->inside_objects);
        std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>::reserve
                  ((vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)local_60,__n);
        pvVar2 = std::
                 vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
                 ::at(&this->voxels,(long)extent.hi.pos._M_elems[2]._4_4_);
        __end0 = std::vector<int,_std::allocator<int>_>::begin(&pvVar2->inside_objects);
        iStack_88 = std::vector<int,_std::allocator<int>_>::end(&pvVar2->inside_objects);
        while (bVar1 = __gnu_cxx::operator!=(&__end0,&stack0xffffffffffffff78), bVar1) {
          piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&__end0);
          children._M_elems._24_8_ =
               std::vector<Parfait::Facet,_std::allocator<Parfait::Facet>_>::operator[]
                         (&this->objects,(long)*piVar3);
          std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>::push_back
                    ((vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)local_60,
                     (value_type *)(children._M_elems + 6));
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&__end0);
        }
        bVar1 = std::
                function<bool_(std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>_&)>
                ::operator()(&this->should_split,
                             (vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)local_60
                            );
        if (bVar1) {
          splitVoxel(this,extent.hi.pos._M_elems[2]._4_4_);
        }
        std::vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_>::~vector
                  ((vector<Parfait::Facet_*,_std::allocator<Parfait::Facet_*>_> *)local_60);
      }
    }
    else {
      pvVar2 = std::
               vector<Parfait::Octree<Parfait::Facet>::Node,_std::allocator<Parfait::Octree<Parfait::Facet>::Node>_>
               ::at(&this->voxels,(long)extent.hi.pos._M_elems[2]._4_4_);
      __range4 = *(array<int,_8UL> **)(pvVar2->children)._M_elems;
      children._M_elems._0_8_ = *(undefined8 *)((pvVar2->children)._M_elems + 2);
      children._M_elems._8_8_ = *(undefined8 *)((pvVar2->children)._M_elems + 4);
      children._M_elems._16_8_ = *(undefined8 *)((pvVar2->children)._M_elems + 6);
      __end0_1 = std::array<int,_8UL>::begin((array<int,_8UL> *)&__range4);
      pvVar4 = std::array<int,_8UL>::end((array<int,_8UL> *)&__range4);
      for (; __end0_1 != pvVar4; __end0_1 = __end0_1 + 1) {
        if (*__end0_1 != -0xb) {
          insert(this,*__end0_1,extent.hi.pos._M_elems[2]._0_4_);
        }
      }
    }
  }
  return;
}

Assistant:

inline void insert(int voxel_index, int object_index) {
          const auto extent = voxels.at(voxel_index).extent;
          if(objects.at(object_index).intersects(extent)) {
              voxels.at(voxel_index).filled = true;
              if(voxels.at(voxel_index).isLeaf()) {
                  voxels.at(voxel_index).inside_objects.push_back(object_index);
                  if(not atMaxDepth(voxel_index)) {
                      std::vector<T*> inside;
                      inside.reserve(voxels.at(voxel_index).inside_objects.size());
                      for(auto i : voxels.at(voxel_index).inside_objects){
                          inside.push_back(&objects[i]);
                      }
                      if(should_split(inside)) {
                          splitVoxel(voxel_index);
                      }
                  }
              }
              else {
                  auto children = voxels.at(voxel_index).children;
                  for (auto child : children) {
                      if(child != Node::EMPTY)
                          insert(child, object_index);
                  }
              }
          }
      }